

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O2

void free_thread_pool(thread_pool *thread_pool)

{
  terminate_threads(thread_pool);
  free_work_queue(&thread_pool->queue);
  free(thread_pool->threads);
  free(thread_pool->thread_data);
  free(thread_pool);
  return;
}

Assistant:

void free_thread_pool(struct thread_pool* thread_pool) {
    terminate_threads(thread_pool);
    free_work_queue(&thread_pool->queue);
    free(thread_pool->threads);
    free(thread_pool->thread_data);
    free(thread_pool);
}